

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edits.cpp
# Opt level: O2

UBool __thiscall icu_63::Edits::growArray(Edits *this)

{
  int iVar1;
  uint16_t *__dest;
  int iVar2;
  
  iVar1 = this->capacity;
  if (this->array == this->stackArray) {
    iVar2 = 2000;
  }
  else {
    if (iVar1 == 0x7fffffff) goto LAB_002f5dac;
    iVar2 = 0x7fffffff;
    if (iVar1 < 0x3fffffff) {
      iVar2 = iVar1 * 2;
    }
  }
  if (4 < iVar2 - iVar1) {
    __dest = (uint16_t *)uprv_malloc_63((long)iVar2 * 2);
    if (__dest == (uint16_t *)0x0) {
      this->errorCode_ = U_MEMORY_ALLOCATION_ERROR;
      return '\0';
    }
    memcpy(__dest,this->array,(long)this->length * 2);
    releaseArray(this);
    this->array = __dest;
    this->capacity = iVar2;
    return '\x01';
  }
LAB_002f5dac:
  this->errorCode_ = U_INDEX_OUTOFBOUNDS_ERROR;
  return '\0';
}

Assistant:

UBool Edits::growArray() {
    int32_t newCapacity;
    if (array == stackArray) {
        newCapacity = 2000;
    } else if (capacity == INT32_MAX) {
        // Not U_BUFFER_OVERFLOW_ERROR because that could be confused on a string transform API
        // with a result-string-buffer overflow.
        errorCode_ = U_INDEX_OUTOFBOUNDS_ERROR;
        return FALSE;
    } else if (capacity >= (INT32_MAX / 2)) {
        newCapacity = INT32_MAX;
    } else {
        newCapacity = 2 * capacity;
    }
    // Grow by at least 5 units so that a maximal change record will fit.
    if ((newCapacity - capacity) < 5) {
        errorCode_ = U_INDEX_OUTOFBOUNDS_ERROR;
        return FALSE;
    }
    uint16_t *newArray = (uint16_t *)uprv_malloc((size_t)newCapacity * 2);
    if (newArray == NULL) {
        errorCode_ = U_MEMORY_ALLOCATION_ERROR;
        return FALSE;
    }
    uprv_memcpy(newArray, array, (size_t)length * 2);
    releaseArray();
    array = newArray;
    capacity = newCapacity;
    return TRUE;
}